

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>
::Iterator::Current(Iterator *this)

{
  DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
  *pDVar1;
  _func_void_uchar_ptr_long_int_int_uchar_ptr_uchar_ptr_int_int_int_int_int *p_Var2;
  int iVar3;
  DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
  *pDVar4;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
      .
      super__Head_base<0UL,_const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
      ._M_head_impl ==
      (DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
       *)0x0) {
    pDVar4 = (DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>
              *)operator_new(0x18);
    pDVar1 = (this->iterator_)._M_current;
    p_Var2 = pDVar1->tst_fn;
    pDVar4->ref_fn = pDVar1->ref_fn;
    pDVar4->tst_fn = p_Var2;
    iVar3 = pDVar1->start_angle;
    pDVar4->bit_depth = pDVar1->bit_depth;
    pDVar4->start_angle = iVar3;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
    .
    super__Head_base<0UL,_const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
    ._M_head_impl = pDVar4;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>,_std::default_delete<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_std::default_delete<const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_>_>
         .
         super__Head_base<0UL,_const_(anonymous_namespace)::DrPredFunc<void_(*)(unsigned_char_*,_long,_int,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int,_int,_int,_int)>_*,_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }